

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric_input.cpp
# Opt level: O1

void Omega_h::add_implied_isos_tag(Mesh *mesh)

{
  size_type *psVar1;
  int *piVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  undefined8 uVar4;
  long *plVar5;
  undefined8 *puVar6;
  Alloc *pAVar7;
  ulong uVar8;
  ScopedTimer omega_h_scoped_function_timer;
  Reals metrics;
  string __str;
  ScopedTimer local_b9;
  string local_b8;
  Alloc *local_98;
  size_type local_90;
  undefined1 local_88 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  void *local_60;
  ulong local_58 [2];
  Alloc *local_48 [2];
  long local_38;
  
  local_48[0] = (Alloc *)&stack0xffffffffffffffc8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_metric_input.cpp"
             ,"");
  plVar5 = (long *)std::__cxx11::string::append((char *)local_48);
  pAVar7 = (Alloc *)(plVar5 + 2);
  if ((Alloc *)*plVar5 == pAVar7) {
    local_88._0_8_ = pAVar7->size;
    local_88._8_8_ = plVar5[3];
    local_98 = (Alloc *)local_88;
  }
  else {
    local_88._0_8_ = pAVar7->size;
    local_98 = (Alloc *)*plVar5;
  }
  local_90 = plVar5[1];
  *plVar5 = (long)pAVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_70._8_8_ = local_58;
  std::__cxx11::string::_M_construct((long)&local_70 + 8,'\x03');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_70._8_8_,3,0x115);
  uVar8 = 0xf;
  if (local_98 != (Alloc *)local_88) {
    uVar8 = local_88._0_8_;
  }
  if (uVar8 < (long)local_60 + local_90) {
    uVar8 = 0xf;
    if ((ulong *)local_70._8_8_ != local_58) {
      uVar8 = local_58[0];
    }
    if ((long)local_60 + local_90 <= uVar8) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((long)&local_70 + 8,0,(char *)0x0,(ulong)local_98);
      goto LAB_003716b8;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_98,local_70._8_8_);
LAB_003716b8:
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  psVar1 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_b8.field_2._M_allocated_capacity = *psVar1;
    local_b8.field_2._8_8_ = puVar6[3];
  }
  else {
    local_b8.field_2._M_allocated_capacity = *psVar1;
    local_b8._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_b8._M_string_length = puVar6[1];
  *puVar6 = psVar1;
  puVar6[1] = 0;
  *(undefined1 *)psVar1 = 0;
  begin_code("add_implied_isos_tag",local_b8._M_dataplus._M_p);
  paVar3 = &local_b8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar3) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((ulong *)local_70._8_8_ != local_58) {
    operator_delete((void *)local_70._8_8_,local_58[0] + 1);
  }
  if (local_98 != (Alloc *)local_88) {
    operator_delete(local_98,local_88._0_8_ + 1);
  }
  if (local_48[0] != (Alloc *)&stack0xffffffffffffffc8) {
    operator_delete(local_48[0],local_38 + 1);
  }
  get_implied_isos((Omega_h *)&local_98,mesh);
  local_88._16_8_ = local_98;
  if (((ulong)local_98 & 7) == 0 && local_98 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_88._16_8_ = local_98->size * 8 + 1;
    }
    else {
      local_98->use_count = local_98->use_count + 1;
    }
  }
  local_70._M_allocated_capacity = local_90;
  local_b8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"metric","");
  add_metric_tag(mesh,(Reals *)(local_88 + 0x10),&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar3) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  uVar4 = local_88._16_8_;
  if ((local_88._16_8_ & 7) == 0 && (Alloc *)local_88._16_8_ != (Alloc *)0x0) {
    piVar2 = (int *)(local_88._16_8_ + 0x30);
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc((Alloc *)local_88._16_8_);
      operator_delete((void *)uVar4,0x48);
    }
  }
  pAVar7 = local_98;
  if (((ulong)local_98 & 7) == 0 && local_98 != (Alloc *)0x0) {
    piVar2 = &local_98->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_98);
      operator_delete(pAVar7,0x48);
    }
  }
  ScopedTimer::~ScopedTimer(&local_b9);
  return;
}

Assistant:

void add_implied_isos_tag(Mesh* mesh) {
  OMEGA_H_TIME_FUNCTION;
  auto metrics = get_implied_isos(mesh);
  add_metric_tag(mesh, metrics, "metric");
}